

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.cpp
# Opt level: O3

UnicodeString *
icu_63::SimpleFormatter::format
          (UChar *compiledPattern,int32_t compiledPatternLength,UnicodeString **values,
          UnicodeString *result,UnicodeString *resultCopy,UBool forbidResultAsValue,int32_t *offsets
          ,int32_t offsetsLength,UErrorCode *errorCode)

{
  UChar UVar1;
  short sVar2;
  UnicodeString *src;
  long lVar3;
  int iVar4;
  int32_t srcLength;
  int iVar5;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (0 < offsetsLength) {
      memset(offsets,0xff,(ulong)(uint)offsetsLength << 2);
    }
    if (1 < compiledPatternLength) {
      iVar5 = 1;
      do {
        lVar3 = (long)iVar5;
        iVar5 = iVar5 + 1;
        UVar1 = compiledPattern[lVar3];
        if ((ushort)UVar1 < 0x100) {
          src = values[(ushort)UVar1];
          if (src == (UnicodeString *)0x0) {
LAB_002a5e1b:
            *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return result;
          }
          if (src == result) {
            if (forbidResultAsValue != '\0') goto LAB_002a5e1b;
            src = resultCopy;
            if (iVar5 == 2) {
              iVar5 = 2;
              if ((int)(uint)(ushort)UVar1 < offsetsLength) {
                offsets[(ushort)UVar1] = 0;
              }
              goto LAB_002a5df7;
            }
          }
          if ((int)(uint)(ushort)UVar1 < offsetsLength) {
            sVar2 = (result->fUnion).fStackFields.fLengthAndFlags;
            if (sVar2 < 0) {
              iVar4 = (result->fUnion).fFields.fLength;
            }
            else {
              iVar4 = (int)sVar2 >> 5;
            }
            offsets[(ushort)UVar1] = iVar4;
          }
          sVar2 = (src->fUnion).fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            srcLength = (src->fUnion).fFields.fLength;
          }
          else {
            srcLength = (int)sVar2 >> 5;
          }
          UnicodeString::doAppend(result,src,0,srcLength);
        }
        else {
          iVar4 = (ushort)UVar1 - 0x100;
          UnicodeString::doAppend(result,compiledPattern + iVar5,0,iVar4);
          iVar5 = iVar5 + iVar4;
        }
LAB_002a5df7:
      } while (iVar5 < compiledPatternLength);
    }
  }
  return result;
}

Assistant:

UnicodeString &SimpleFormatter::format(
        const UChar *compiledPattern, int32_t compiledPatternLength,
        const UnicodeString *const *values,
        UnicodeString &result, const UnicodeString *resultCopy, UBool forbidResultAsValue,
        int32_t *offsets, int32_t offsetsLength,
        UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return result;
    }
    for (int32_t i = 0; i < offsetsLength; i++) {
        offsets[i] = -1;
    }
    for (int32_t i = 1; i < compiledPatternLength;) {
        int32_t n = compiledPattern[i++];
        if (n < ARG_NUM_LIMIT) {
            const UnicodeString *value = values[n];
            if (value == NULL) {
                errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                return result;
            }
            if (value == &result) {
                if (forbidResultAsValue) {
                    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                    return result;
                }
                if (i == 2) {
                    // We are appending to result which is also the first value object.
                    if (n < offsetsLength) {
                        offsets[n] = 0;
                    }
                } else {
                    if (n < offsetsLength) {
                        offsets[n] = result.length();
                    }
                    result.append(*resultCopy);
                }
            } else {
                if (n < offsetsLength) {
                    offsets[n] = result.length();
                }
                result.append(*value);
            }
        } else {
            int32_t length = n - ARG_NUM_LIMIT;
            result.append(compiledPattern + i, length);
            i += length;
        }
    }
    return result;
}